

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O2

_Bool aux_object(chunk *c,player *p,target_aux_state *auxst)

{
  object *poVar1;
  char *pcVar2;
  char *pcVar3;
  unkbyte9 Var4;
  bool bVar5;
  wchar_t wVar6;
  uint uVar7;
  wchar_t wVar8;
  object **items;
  long lVar9;
  ushort uVar10;
  _Bool _Var11;
  long lVar12;
  ui_event uVar13;
  char local_188 [80];
  char out_val [256];
  
  uVar10 = z_info->floor_size;
  items = (object **)mem_zalloc((ulong)((uint)uVar10 * 8));
  wVar6 = scan_distant_floor(items,(uint)uVar10,p,auxst->grid);
  if (wVar6 < L'\x01') {
    mem_free(items);
    return false;
  }
  auxst->boring = false;
  track_object(p->upkeep,*items);
  handle_stuff(p);
  if (wVar6 != L'\x01') {
    do {
      if (p->wizard == true) {
        lVar9 = (long)(auxst->grid).y;
        lVar12 = (long)(auxst->grid).x;
        strnfmt(out_val,0x100,"%s%sa pile of %d objects, %s (%d:%d, noise=%d, scent=%d).",
                auxst->phrase1,auxst->phrase2,(ulong)(uint)wVar6,auxst,lVar9,lVar12,
                (ulong)(c->noise).grids[lVar9][lVar12],(ulong)(c->scent).grids[lVar9][lVar12]);
      }
      else {
        strnfmt(out_val,0x100,"%s%sa pile of %d objects, %s.",auxst->phrase1,auxst->phrase2,
                (ulong)(uint)wVar6,auxst);
      }
      _Var11 = false;
      prt(out_val,L'\0',L'\0');
      move_cursor_relative((auxst->grid).y,(auxst->grid).x);
      uVar13 = inkey_m();
      *(mouseclick *)&auxst->press = uVar13.mouse;
      (auxst->press).key.mods = uVar13.key.mods;
      if (uVar13.type == EVT_KBRD) {
        if (uVar13.key.code != 0x72) goto LAB_001f8a18;
      }
      else {
        if (uVar13.type != EVT_MOUSE) goto LAB_001f8a26;
        if (((((ulong)uVar13.mouse & 0xff000000000000) != 0x1000000000000) ||
            ((int)((uint)(byte)uVar13.key.code - col_map[Term->sidebar_mode]) /
             (int)(uint)tile_width + Term->offset_x != (auxst->grid).x)) ||
           ((int)((uVar13.key.code >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
            (int)(uint)tile_height + Term->offset_y != (auxst->grid).y)) goto LAB_001f8a18;
      }
      while( true ) {
        screen_save();
        show_floor(items,wVar6,L'\x8c',(item_tester)0x0);
        prt(out_val,L'\0',L'\0');
        uVar13 = inkey_m();
        (auxst->press).mouse = uVar13.mouse;
        (auxst->press).key.mods = uVar13.key.mods;
        screen_load();
        if ((auxst->press).type == EVT_MOUSE) {
          wVar8 = (uint)(auxst->press).mouse.y + L'\xffffffff';
        }
        else {
          wVar8 = (auxst->press).key.code + L'\xffffff9f';
        }
        if ((uint)wVar6 <= (uint)wVar8) break;
        track_object(p->upkeep,items[(uint)wVar8]);
        handle_stuff(p);
      }
    } while( true );
  }
  poVar1 = *items;
  wVar6 = (auxst->grid).y;
  lVar12 = (long)wVar6;
  wVar8 = (auxst->grid).x;
  lVar9 = (long)wVar8;
  pcVar2 = auxst->phrase1;
  pcVar3 = auxst->phrase2;
  bVar5 = false;
  do {
    if (bVar5) {
      display_object_recall_interactive(cave->objects[poVar1->oidx]);
      uVar13 = inkey_m();
      Var4 = uVar13._0_9_;
    }
    else {
      object_desc(local_188,0x50,cave->objects[poVar1->oidx],0x43,p);
      if (p->wizard == true) {
        strnfmt(out_val,0x100,"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",pcVar2,pcVar3,"",local_188
                ,auxst,lVar12,lVar9,(ulong)(cave->noise).grids[lVar12][lVar9],
                (ulong)(cave->scent).grids[lVar12][lVar9]);
      }
      else {
        strnfmt(out_val,0x100,"%s%s%s%s, %s.",pcVar2,pcVar3,"",local_188,auxst);
      }
      prt(out_val,L'\0',L'\0');
      move_cursor_relative(wVar6,wVar8);
      uVar13 = inkey_m();
      Var4 = uVar13._0_9_;
    }
    uVar10 = (ushort)((unkuint9)Var4 >> 0x30) & 0xff;
    uVar7 = (uint)((unkuint9)Var4 >> 0x20);
    if (((uVar10 != 1 || (int)Var4 != 2) ||
        ((int)((uVar7 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
         Term->offset_x != wVar8)) ||
       ((int)((uVar7 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
        Term->offset_y != wVar6)) {
      uVar7 = (uVar7 >> 8 & 0xff) << 8 | (uint)uVar10 << 0x10 | uVar7 & 0xff000000 | uVar7 & 0xff;
      if (((int)Var4 != 1) || (uVar7 != 0x72)) goto LAB_001f89ee;
    }
    bVar5 = (bool)(bVar5 ^ 1);
  } while( true );
LAB_001f8a18:
  _Var11 = false;
  goto LAB_001f8a26;
LAB_001f89ee:
  (auxst->press).mouse = (mouseclick)((ulong)Var4 & 0xffffffff | (ulong)uVar7 << 0x20);
  (auxst->press).key.mods = (uint8_t)((unkuint9)Var4 >> 0x40);
  if (uVar7 == 0x20) {
    _Var11 = (auxst->mode & L'\x02') == L'\0';
  }
  else {
    _Var11 = uVar7 != 0x9c && uVar7 != 0x20;
  }
LAB_001f8a26:
  mem_free(items);
  return _Var11;
}

Assistant:

static bool aux_object(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	int floor_max = z_info->floor_size;
	struct object **floor_list =
		mem_zalloc(floor_max * sizeof(*floor_list));
	bool result = false;
	char out_val[TARGET_OUT_VAL_SIZE];
	int floor_num;

	/* Scan all sensed objects in the grid */
	floor_num = scan_distant_floor(floor_list, floor_max, p, auxst->grid);
	if (floor_num <= 0) {
		mem_free(floor_list);
		return result;
	}

	/* Not boring */
	auxst->boring = false;

	track_object(p->upkeep, floor_list[0]);
	handle_stuff(p);

	/* If there is more than one item... */
	if (floor_num > 1) {
		while (1) {
			/* Describe the pile */
			if (p->wizard) {
				strnfmt(out_val, sizeof(out_val),
					"%s%sa pile of %d objects, %s (%d:%d, noise=%d, scent=%d).",
					auxst->phrase1,
					auxst->phrase2,
					floor_num,
					auxst->coord_desc,
					auxst->grid.y,
					auxst->grid.x,
					(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
					(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
			} else {
				strnfmt(out_val, sizeof(out_val),
					"%s%sa pile of %d objects, %s.",
					auxst->phrase1,
					auxst->phrase2,
					floor_num,
					auxst->coord_desc);
			}

			prt(out_val, 0, 0);
			move_cursor_relative(auxst->grid.y, auxst->grid.x);
			auxst->press = inkey_m();

			/* Display objects */
			if ((auxst->press.type == EVT_MOUSE
					&& auxst->press.mouse.button == 1
					&& KEY_GRID_X(auxst->press) ==
					auxst->grid.x
					&& KEY_GRID_Y(auxst->press) ==
					auxst->grid.y)
					|| (auxst->press.type == EVT_KBRD
					&& auxst->press.key.code == 'r')) {
				int pos;
				while (1) {
					/* Save screen */
					screen_save();

					/*
					 * Use OLIST_DEATH to show item labels
					 */
					show_floor(floor_list, floor_num,
						(OLIST_DEATH | OLIST_WEIGHT
						| OLIST_GOLD), NULL);

					/* Describe the pile */
					prt(out_val, 0, 0);
					auxst->press = inkey_m();

					/* Load screen */
					screen_load();

					if (auxst->press.type == EVT_MOUSE) {
						pos = auxst->press.mouse.y - 1;
					} else {
						pos = auxst->press.key.code -
							'a';
					}
					if (0 <= pos && pos < floor_num) {
						track_object(p->upkeep,
							floor_list[pos]);
						handle_stuff(p);
						continue;
					}
					break;
				}

				/*
				 * Now that the user's done with the display
				 * loop, let's do the outer loop over again.
				 */
				continue;
			}

			/* Done */
			break;
		}
	} else {
		/* Only one object to display */
		/* Get the single object in the list */
		struct object *obj_local = floor_list[0];

		/* Allow user to recall an object */
		auxst->press = target_recall_loop_object(obj_local,
			auxst->grid.y, auxst->grid.x, out_val, auxst->phrase1,
			auxst->phrase2, "", auxst->coord_desc, p);

		/* Stop on everything but "return"/"space" */
		if (auxst->press.key.code != KC_ENTER
				&& auxst->press.key.code != ' ') result = true;

		/* Sometimes stop at "space" key */
		if (auxst->press.key.code == ' '
				&& !(auxst->mode & (TARGET_LOOK))) result = true;
	}

	mem_free(floor_list);
	return result;
}